

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool mkvparser::Projection::Parse
               (IMkvReader *reader,longlong start,longlong size,Projection **projection)

{
  uchar *puVar1;
  longlong lVar2;
  ProjectionType PVar3;
  Projection *this;
  pointer pPVar4;
  long lVar5;
  float fVar6;
  longlong value_parse_status;
  double value;
  uchar *puStack_80;
  int status_1;
  uchar *data;
  longlong projection_type;
  longlong status;
  longlong child_size;
  longlong child_id;
  longlong read_pos;
  longlong end;
  unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> local_38;
  unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> projection_ptr;
  Projection **projection_local;
  longlong size_local;
  longlong start_local;
  IMkvReader *reader_local;
  
  if ((reader == (IMkvReader *)0x0) || (*projection != (Projection *)0x0)) {
    reader_local._7_1_ = false;
  }
  else {
    projection_ptr._M_t.
    super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>._M_t.
    super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>.
    super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvparser::Projection,_std::default_delete<mkvparser::Projection>,_true,_true>
          )(__uniq_ptr_data<mkvparser::Projection,_std::default_delete<mkvparser::Projection>,_true,_true>
            )projection;
    this = (Projection *)operator_new(0x28);
    Projection(this);
    std::unique_ptr<mkvparser::Projection,std::default_delete<mkvparser::Projection>>::
    unique_ptr<std::default_delete<mkvparser::Projection>,void>
              ((unique_ptr<mkvparser::Projection,std::default_delete<mkvparser::Projection>> *)
               &local_38,this);
    pPVar4 = std::unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
             get(&local_38);
    if (pPVar4 == (pointer)0x0) {
      reader_local._7_1_ = false;
    }
    else {
      read_pos = start + size;
      child_id = start;
      do {
        if (read_pos <= child_id) {
          pPVar4 = std::
                   unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
                   release(&local_38);
          *(pointer *)
           projection_ptr._M_t.
           super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
           ._M_t.
           super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
           .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl = pPVar4;
          reader_local._7_1_ = true;
          goto LAB_001204d7;
        }
        child_size = 0;
        status = 0;
        projection_type = ParseElementHeader(reader,&child_id,read_pos,&child_size,&status);
        if (projection_type < 0) {
          reader_local._7_1_ = false;
          goto LAB_001204d7;
        }
        if (child_size == 0x7671) {
          data = (uchar *)0xffffffffffffffff;
          data = (uchar *)UnserializeUInt(reader,child_id,status);
          if ((long)data < 0) {
            reader_local._7_1_ = false;
            goto LAB_001204d7;
          }
          PVar3 = (ProjectionType)data;
          pPVar4 = std::
                   unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
                   operator->(&local_38);
          pPVar4->type = PVar3;
        }
        else if (child_size == 0x7672) {
          puStack_80 = SafeArrayAlloc<unsigned_char>(1,status);
          if (puStack_80 == (uchar *)0x0) {
            reader_local._7_1_ = false;
            goto LAB_001204d7;
          }
          value._4_4_ = (**reader->_vptr_IMkvReader)(reader,child_id,status,puStack_80);
          puVar1 = puStack_80;
          if (value._4_4_ != 0) {
            if (puStack_80 != (uchar *)0x0) {
              operator_delete__(puStack_80);
            }
            reader_local._7_1_ = false;
            goto LAB_001204d7;
          }
          pPVar4 = std::
                   unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
                   operator->(&local_38);
          lVar2 = status;
          pPVar4->private_data = puVar1;
          pPVar4 = std::
                   unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
                   operator->(&local_38);
          pPVar4->private_data_length = lVar2;
        }
        else {
          value_parse_status = 0;
          lVar5 = UnserializeFloat(reader,child_id,status,(double *)&value_parse_status);
          if ((((lVar5 < 0) || ((double)value_parse_status < -3.4028234663852886e+38)) ||
              (3.4028234663852886e+38 < (double)value_parse_status)) ||
             ((0.0 < (double)value_parse_status &&
              ((double)value_parse_status < 1.1754943508222875e-38)))) {
            reader_local._7_1_ = false;
            goto LAB_001204d7;
          }
          if (child_size == 0x7673) {
            fVar6 = (float)(double)value_parse_status;
            pPVar4 = std::
                     unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                     ::operator->(&local_38);
            pPVar4->pose_yaw = fVar6;
          }
          else if (child_size == 0x7674) {
            fVar6 = (float)(double)value_parse_status;
            pPVar4 = std::
                     unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                     ::operator->(&local_38);
            pPVar4->pose_pitch = fVar6;
          }
          else {
            if (child_size != 0x7675) {
              reader_local._7_1_ = false;
              goto LAB_001204d7;
            }
            fVar6 = (float)(double)value_parse_status;
            pPVar4 = std::
                     unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                     ::operator->(&local_38);
            pPVar4->pose_roll = fVar6;
          }
        }
        child_id = status + child_id;
      } while (child_id <= read_pos);
      reader_local._7_1_ = false;
    }
LAB_001204d7:
    end._0_4_ = 1;
    std::unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::~unique_ptr
              (&local_38);
  }
  return reader_local._7_1_;
}

Assistant:

bool Projection::Parse(IMkvReader* reader, long long start, long long size,
                       Projection** projection) {
  if (!reader || *projection)
    return false;

  std::unique_ptr<Projection> projection_ptr(new Projection());
  if (!projection_ptr.get())
    return false;

  const long long end = start + size;
  long long read_pos = start;

  while (read_pos < end) {
    long long child_id = 0;
    long long child_size = 0;

    const long long status =
        ParseElementHeader(reader, read_pos, end, child_id, child_size);
    if (status < 0)
      return false;

    if (child_id == libwebm::kMkvProjectionType) {
      long long projection_type = kTypeNotPresent;
      projection_type = UnserializeUInt(reader, read_pos, child_size);
      if (projection_type < 0)
        return false;

      projection_ptr->type = static_cast<ProjectionType>(projection_type);
    } else if (child_id == libwebm::kMkvProjectionPrivate) {
      unsigned char* data = SafeArrayAlloc<unsigned char>(1, child_size);

      if (data == NULL)
        return false;

      const int status =
          reader->Read(read_pos, static_cast<long>(child_size), data);

      if (status) {
        delete[] data;
        return false;
      }

      projection_ptr->private_data = data;
      projection_ptr->private_data_length = static_cast<size_t>(child_size);
    } else {
      double value = 0;
      const long long value_parse_status =
          UnserializeFloat(reader, read_pos, child_size, value);
      // Make sure value is representable as a float before casting.
      if (value_parse_status < 0 || value < -FLT_MAX || value > FLT_MAX ||
          (value > 0.0 && value < FLT_MIN)) {
        return false;
      }

      switch (child_id) {
        case libwebm::kMkvProjectionPoseYaw:
          projection_ptr->pose_yaw = static_cast<float>(value);
          break;
        case libwebm::kMkvProjectionPosePitch:
          projection_ptr->pose_pitch = static_cast<float>(value);
          break;
        case libwebm::kMkvProjectionPoseRoll:
          projection_ptr->pose_roll = static_cast<float>(value);
          break;
        default:
          return false;
      }
    }

    read_pos += child_size;
    if (read_pos > end)
      return false;
  }

  *projection = projection_ptr.release();
  return true;
}